

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

void google::protobuf::StripString(string *s,char *remove,char replacewith)

{
  char *pcVar1;
  char *local_30;
  char *str;
  char *str_start;
  char replacewith_local;
  char *remove_local;
  string *s_local;
  
  pcVar1 = (char *)std::__cxx11::string::c_str();
  for (local_30 = strpbrk(pcVar1,remove); local_30 != (char *)0x0;
      local_30 = strpbrk(local_30 + 1,remove)) {
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)s);
    *pcVar1 = replacewith;
  }
  return;
}

Assistant:

void StripString(string* s, const char* remove, char replacewith) {
  const char * str_start = s->c_str();
  const char * str = str_start;
  for (str = strpbrk(str, remove);
       str != NULL;
       str = strpbrk(str + 1, remove)) {
    (*s)[str - str_start] = replacewith;
  }
}